

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  char *__ptr;
  size_t sStack_20;
  
  mraa_init();
  lVar3 = mraa_led_init(0);
  if (lVar3 == 0) {
    fwrite("Failed to initialize LED\n",0x19,1,_stderr);
  }
  else {
    uVar1 = mraa_led_read_max_brightness(lVar3);
    fprintf(_stdout,"maximum brightness value for LED is: %d\n",(ulong)uVar1);
    iVar2 = mraa_led_set_brightness(lVar3,(int)uVar1 < 1);
    if (iVar2 == 0) {
      sleep(5);
      iVar2 = mraa_led_set_trigger(lVar3,"heartbeat");
      if (iVar2 == 0) {
        fwrite("LED trigger set to: heartbeat\n",0x1e,1,_stdout);
        mraa_led_close(lVar3);
        iVar2 = 0;
        goto LAB_0010126c;
      }
      __ptr = "unable to set LED trigger to: heartbeat\n";
      sStack_20 = 0x28;
    }
    else {
      __ptr = "unable to set LED brightness\n";
      sStack_20 = 0x1d;
    }
    fwrite(__ptr,sStack_20,1,_stderr);
    mraa_result_print(iVar2);
  }
  iVar2 = 1;
LAB_0010126c:
  mraa_deinit();
  return iVar2;
}

Assistant:

int
main(void)
{
    mraa_result_t status = MRAA_SUCCESS;
    mraa_led_context led;
    int val;

    /* initialize mraa for the platform (not needed most of the time) */
    mraa_init();

    //! [Interesting]
    /* initialize LED */
    led = mraa_led_init(USER_LED);
    if (led == NULL) {
        fprintf(stderr, "Failed to initialize LED\n");
        mraa_deinit();
        return EXIT_FAILURE;
    }

    /* read maximum brightness */
    val = mraa_led_read_max_brightness(led);
    fprintf(stdout, "maximum brightness value for LED is: %d\n", val);
    if (val >= 1) {
        val = 0;
    } else {
        /* never reached mostly */
        val = 1;
    }

    /* turn LED on/off depending on max_brightness value */
    status = mraa_led_set_brightness(led, val);
    if (status != MRAA_SUCCESS) {
        fprintf(stderr, "unable to set LED brightness\n");
        goto err_exit;
    }

    /* sleep for 5 seconds */
    sleep(5);

    /* set LED trigger to heartbeat */
    status = mraa_led_set_trigger(led, LED_TRIGGER);
    if (status != MRAA_SUCCESS) {
        fprintf(stderr, "unable to set LED trigger to: heartbeat\n");
        goto err_exit;
    }

    fprintf(stdout, "LED trigger set to: heartbeat\n");

    /* close LED */
    mraa_led_close(led);

    //! [Interesting]
    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_SUCCESS;

err_exit:
    mraa_result_print(status);

    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_FAILURE;
}